

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

shared_ptr<httplib::Response> __thiscall
httplib::Client::Get(Client *this,char *path,Headers *headers,Progress *progress)

{
  function<bool_(unsigned_long,_unsigned_long)> *__x;
  element_type *__buf;
  ulong uVar1;
  Progress *__n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_R8D;
  undefined4 in_register_00000084;
  shared_ptr<httplib::Response> sVar2;
  undefined1 local_1c0 [8];
  shared_ptr<httplib::Response> res;
  undefined1 local_1a0 [8];
  Request req;
  Progress *progress_local;
  Headers *headers_local;
  char *path_local;
  Client *this_local;
  
  __x = (function<bool_(unsigned_long,_unsigned_long)> *)CONCAT44(in_register_00000084,in_R8D);
  __n = progress;
  Request::Request((Request *)local_1a0);
  std::__cxx11::string::operator=((string *)(req.version.field_2._M_local_buf + 8),"GET");
  std::__cxx11::string::operator=((string *)(req.target.field_2._M_local_buf + 8),(char *)headers);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&req.path.field_2 + 8),
              (multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)progress);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=
            ((function<bool_(unsigned_long,_unsigned_long)> *)&req.matches._M_begin,__x);
  std::make_shared<httplib::Response>();
  __buf = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_1c0);
  uVar1 = send((Client *)path,(int)local_1a0,__buf,(size_t)__n,in_R8D);
  if ((uVar1 & 1) == 0) {
    std::shared_ptr<httplib::Response>::shared_ptr
              ((shared_ptr<httplib::Response> *)this,(nullptr_t)0x0);
  }
  else {
    std::shared_ptr<httplib::Response>::shared_ptr
              ((shared_ptr<httplib::Response> *)this,(shared_ptr<httplib::Response> *)local_1c0);
  }
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_1c0);
  Request::~Request((Request *)local_1a0);
  sVar2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<httplib::Response>)
         sVar2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<Response> Client::Get(const char* path, const Headers& headers, Progress progress)
{
    Request req;
    req.method = "GET";
    req.path = path;
    req.headers = headers;
    req.progress = progress;

    auto res = std::make_shared<Response>();

    return send(req, *res) ? res : nullptr;
}